

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_traceexec(lua_State *L)

{
  int *piVar1;
  byte bVar2;
  CallInfo *pCVar3;
  lua_CFunction p_Var4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  Instruction *pIVar8;
  int line;
  byte bVar9;
  int iVar10;
  char *__assertion;
  
  bVar2 = L->hookmask;
  pCVar3 = L->ci;
  piVar1 = &L->hookcount;
  *piVar1 = *piVar1 + -1;
  bVar9 = (byte)((bVar2 & 8) >> 3) & *piVar1 == 0;
  if (bVar9 == 0) {
    if ((bVar2 & 4) == 0) {
      return;
    }
    uVar7 = pCVar3->callstatus;
    if ((uVar7 & 0x40) != 0) goto LAB_0012ad04;
LAB_0012acbf:
    if (pCVar3->func->tt_ != 0x8006) {
      __assertion = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_0012ad86:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x2d5,"void luaG_traceexec(lua_State *)");
    }
    p_Var4 = (pCVar3->func->value_).f;
    if (p_Var4[8] != (_func_int_lua_State_ptr)0x6) {
      __assertion = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
      goto LAB_0012ad86;
    }
    lVar5 = *(long *)(p_Var4 + 0x18);
    pIVar8 = (pCVar3->u).l.savedpc;
    lVar6 = *(long *)(lVar5 + 0x38);
    lVar5 = *(long *)(lVar5 + 0x48);
    iVar10 = (int)((ulong)((long)pIVar8 - lVar6) >> 2) + -1;
    if (lVar5 == 0) {
      line = -1;
    }
    else {
      line = *(int *)(lVar5 + (long)iVar10 * 4);
    }
    if ((iVar10 == 0) || (pIVar8 <= L->oldpc)) {
LAB_0012ad50:
      luaD_hook(L,2,line);
    }
    else {
      if (lVar5 == 0) {
        iVar10 = -1;
      }
      else {
        iVar10 = *(int *)(lVar5 + (((long)L->oldpc - lVar6) * 0x40000000 + -0x100000000 >> 0x20) * 4
                         );
      }
      if (line != iVar10) goto LAB_0012ad50;
    }
    pIVar8 = (pCVar3->u).l.savedpc;
    L->oldpc = pIVar8;
    if (L->status != '\x01') {
      return;
    }
    if (bVar9 == 0) goto LAB_0012adb4;
  }
  else {
    L->hookcount = L->basehookcount;
    uVar7 = pCVar3->callstatus;
    if ((uVar7 & 0x40) != 0) {
LAB_0012ad04:
      pCVar3->callstatus = uVar7 & 0xffbf;
      return;
    }
    luaD_hook(L,3,-1);
    if ((bVar2 & 4) != 0) goto LAB_0012acbf;
    L->oldpc = (pCVar3->u).l.savedpc;
    if (L->status != '\x01') {
      return;
    }
  }
  L->hookcount = 1;
  pIVar8 = (pCVar3->u).l.savedpc;
LAB_0012adb4:
  (pCVar3->u).l.savedpc = pIVar8 + -1;
  *(byte *)&pCVar3->callstatus = (byte)pCVar3->callstatus | 0x40;
  pCVar3->func = L->top + -1;
  luaD_throw(L,1);
}

Assistant:

void luaG_traceexec (lua_State *L) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  int counthook = (--L->hookcount == 0 && (mask & LUA_MASKCOUNT));
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return;  /* no line hook and count != 0; nothing to be done */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* called hook last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    Proto *p = ci_func(ci)->p;
    int npc = pcRel(ci->u.l.savedpc, p);
    int newline = getfuncline(p, npc);
    if (npc == 0 ||  /* call linehook when enter a new function, */
        ci->u.l.savedpc <= L->oldpc ||  /* when jump back (loop), or when */
        newline != getfuncline(p, pcRel(L->oldpc, p)))  /* enter a new line */
      luaD_hook(L, LUA_HOOKLINE, newline);  /* call line hook */
  }
  L->oldpc = ci->u.l.savedpc;
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->u.l.savedpc--;  /* undo increment (resume will increment it again) */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    ci->func = L->top - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
}